

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVP.cpp
# Opt level: O1

void __thiscall MT32Emu::TVP::setupPitchChange(TVP *this,int targetPitchOffset,Bit8u changeDuration)

{
  int iVar1;
  short sVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  short sVar6;
  Bit8u leftShifts;
  byte bVar7;
  int iVar8;
  ushort uVar9;
  
  iVar1 = this->currentPitchOffset;
  iVar4 = targetPitchOffset - iVar1;
  iVar8 = 0x7fff;
  if ((short)iVar4 == iVar4) {
    iVar8 = iVar4;
  }
  iVar4 = -iVar8;
  if (iVar1 <= targetPitchOffset) {
    iVar4 = iVar8;
  }
  uVar5 = iVar4 << 0x10;
  bVar7 = 0;
  do {
    if ((int)uVar5 < 0) goto LAB_0011e857;
    uVar5 = uVar5 * 2;
    bVar7 = bVar7 + 1;
  } while (bVar7 != 0x1f);
  bVar7 = 0x1f;
LAB_0011e857:
  bVar3 = (byte)(changeDuration - 1) >> 3;
  uVar9 = *(ushort *)(lowerDurationToDivisor + (ulong)((byte)(changeDuration - 1) & 7) * 2);
  sVar2 = (short)((ulong)(uVar5 >> 1 & 0x7fff0000) / (ulong)uVar9 >> 1);
  sVar6 = -sVar2;
  if (iVar1 <= targetPitchOffset) {
    sVar6 = sVar2;
  }
  this->shifts = bVar3 + 2 + (uint)bVar7;
  this->pitchOffsetChangePerBigTick = sVar6;
  uVar9 = uVar9 >> (0xc - bVar3 & 0x1f);
  if (0x7ffe < uVar9) {
    uVar9 = 0x7fff;
  }
  this->targetPitchOffsetReachedBigTick = uVar9 + (short)(this->timeElapsed >> 8);
  return;
}

Assistant:

void TVP::setupPitchChange(int targetPitchOffset, Bit8u changeDuration) {
	bool negativeDelta = targetPitchOffset < currentPitchOffset;
	Bit32s pitchOffsetDelta = targetPitchOffset - currentPitchOffset;
	if (pitchOffsetDelta > 32767 || pitchOffsetDelta < -32768) {
		pitchOffsetDelta = 32767;
	}
	if (negativeDelta) {
		pitchOffsetDelta = -pitchOffsetDelta;
	}
	// We want to maximise the number of bits of the Bit16s "pitchOffsetChangePerBigTick" we use in order to get the best possible precision later
	Bit32u absPitchOffsetDelta = (pitchOffsetDelta & 0xFFFF) << 16;
	Bit8u normalisationShifts = normalise(absPitchOffsetDelta); // FIXME: Double-check: normalisationShifts is usually between 0 and 15 here, unless the delta is 0, in which case it's 31
	absPitchOffsetDelta = absPitchOffsetDelta >> 1; // Make room for the sign bit

	changeDuration--; // changeDuration's now between 0 and 111
	unsigned int upperDuration = changeDuration >> 3; // upperDuration's now between 0 and 13
	shifts = normalisationShifts + upperDuration + 2;
	Bit16u divisor = lowerDurationToDivisor[changeDuration & 7];
	Bit16s newPitchOffsetChangePerBigTick = ((absPitchOffsetDelta & 0xFFFF0000) / divisor) >> 1; // Result now fits within 15 bits. FIXME: Check nothing's getting sign-extended incorrectly
	if (negativeDelta) {
		newPitchOffsetChangePerBigTick = -newPitchOffsetChangePerBigTick;
	}
	pitchOffsetChangePerBigTick = newPitchOffsetChangePerBigTick;

	int currentBigTick = timeElapsed >> 8;
	int durationInBigTicks = divisor >> (12 - upperDuration);
	if (durationInBigTicks > 32767) {
		durationInBigTicks = 32767;
	}
	// The result of the addition may exceed 16 bits, but wrapping is fine and intended here.
	targetPitchOffsetReachedBigTick = currentBigTick + durationInBigTicks;
}